

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O2

BIGNUM * BN_lebin2bn(uchar *s,int len,BIGNUM *ret)

{
  byte *pbVar1;
  int iVar2;
  BIGNUM *pBVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint words;
  BIGNUM *a;
  uchar *puVar8;
  ulong uVar7;
  
  if (ret == (BIGNUM *)0x0) {
    ret = (BIGNUM *)BN_new();
    a = (BIGNUM *)ret;
    if (ret == (BIGNUM *)0x0) {
      return (BIGNUM *)0x0;
    }
  }
  else {
    a = (BIGNUM *)0x0;
  }
  puVar8 = s + len;
  for (iVar2 = len; 0 < iVar2; iVar2 = iVar2 + -1) {
    if (puVar8[-1] != '\0') goto LAB_00111d95;
    puVar8 = puVar8 + -1;
  }
  iVar2 = len;
  if (-1 < len) {
    ret->top = 0;
    return ret;
  }
LAB_00111d95:
  words = (iVar2 - 1U >> 3) + 1;
  uVar7 = (ulong)words;
  pBVar3 = bn_wexpand(ret,words);
  if (pBVar3 == (BIGNUM *)0x0) {
    BN_free(a);
    return (BIGNUM *)0x0;
  }
  uVar6 = iVar2 - 1U & 7;
  ret->top = words;
  ret->neg = 0;
  do {
    iVar4 = 0;
    uVar5 = 0;
    do {
      if (iVar2 == iVar4) {
        bn_correct_top(ret);
        return ret;
      }
      pbVar1 = puVar8 + -1;
      puVar8 = puVar8 + -1;
      uVar5 = (ulong)*pbVar1 | uVar5 << 8;
      iVar4 = iVar4 + 1;
    } while (uVar6 + 1 != iVar4);
    uVar7 = (ulong)((int)uVar7 - 1);
    ret->d[uVar7] = uVar5;
    iVar2 = iVar2 - iVar4;
    uVar6 = 7;
  } while( true );
}

Assistant:

BIGNUM *BN_lebin2bn(const unsigned char *s, int len, BIGNUM *ret)
{
    unsigned int i, m;
    unsigned int n;
    BN_ULONG l;
    BIGNUM *bn = NULL;

    if (ret == NULL)
        ret = bn = BN_new();
    if (ret == NULL)
        return (NULL);
    bn_check_top(ret);
    s += len;
    /* Skip trailing zeroes. */
    for ( ; len > 0 && s[-1] == 0; s--, len--)
        continue;
    n = len;
    if (n == 0) {
        ret->top = 0;
        return ret;
    }
    i = ((n - 1) / BN_BYTES) + 1;
    m = ((n - 1) % (BN_BYTES));
    if (bn_wexpand(ret, (int)i) == NULL) {
        BN_free(bn);
        return NULL;
    }
    ret->top = i;
    ret->neg = 0;
    l = 0;
    while (n--) {
        s--;
        l = (l << 8L) | *s;
        if (m-- == 0) {
            ret->d[--i] = l;
            l = 0;
            m = BN_BYTES - 1;
        }
    }
    /*
     * need to call this due to clear byte at top if avoiding having the top
     * bit set (-ve number)
     */
    bn_correct_top(ret);
    return ret;
}